

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript.hpp
# Opt level: O2

void __thiscall chaiscript::ChaiScript::~ChaiScript(ChaiScript *this)

{
  ChaiScript_Basic::~ChaiScript_Basic(&this->super_ChaiScript_Basic);
  operator_delete(this,0x2d8);
  return;
}

Assistant:

ChaiScript(std::vector<std::string> t_modulepaths = {},
               std::vector<std::string> t_usepaths = {},
               std::vector<Options> t_opts = chaiscript::default_options())
        : ChaiScript_Basic(chaiscript::Std_Lib::library(),
                           std::make_unique<parser::ChaiScript_Parser<eval::Noop_Tracer, optimizer::Optimizer_Default>>(),
                           std::move(t_modulepaths),
                           std::move(t_usepaths),
                           std::move(t_opts)) {
    }